

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(short lhs,
         SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  short ret;
  short local_14;
  short local_12;
  long local_10;
  
  SVar1.m_int = 0x8000;
  if (lhs != -0x8000 || rhs.m_int != -1) {
    local_12 = 0;
    local_14 = lhs;
    local_10 = rhs.m_int;
    DivisionHelper<short,long,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_14,&local_10,&local_12);
    SVar1.m_int = (long)local_12;
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         SVar1.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}